

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O0

void __thiscall Client::Send(Client *this,string *data)

{
  undefined1 uVar1;
  ulong uVar2;
  long lVar3;
  undefined1 *puVar4;
  ulong local_28;
  size_t i;
  size_t mask;
  string *data_local;
  Client *this_local;
  
  uVar2 = std::__cxx11::string::length();
  lVar3 = std::__cxx11::string::length();
  if (lVar3 - this->send_buffer_used < uVar2) {
    Close(this,true);
  }
  else {
    lVar3 = std::__cxx11::string::length();
    local_28 = 0;
    while( true ) {
      uVar2 = std::__cxx11::string::length();
      if (uVar2 <= local_28) break;
      this->send_buffer_ppos = this->send_buffer_ppos + 1 & lVar3 - 1U;
      puVar4 = (undefined1 *)std::__cxx11::string::operator[]((ulong)data);
      uVar1 = *puVar4;
      puVar4 = (undefined1 *)std::__cxx11::string::operator[]((ulong)&this->send_buffer);
      *puVar4 = uVar1;
      local_28 = local_28 + 1;
    }
    lVar3 = std::__cxx11::string::length();
    this->send_buffer_used = lVar3 + this->send_buffer_used;
  }
  return;
}

Assistant:

void Client::Send(const std::string &data)
{
	if (data.length() > this->send_buffer.length() - this->send_buffer_used)
	{
		this->Close(true);
		return;
	}

	const std::size_t mask = this->send_buffer.length() - 1;

	for (std::size_t i = 0; i < data.length(); ++i)
	{
		this->send_buffer_ppos = (this->send_buffer_ppos + 1) & mask;
		this->send_buffer[this->send_buffer_ppos] = data[i];
	}

	this->send_buffer_used += data.length();
}